

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData *
cfd::core::CryptoUtil::DecryptAes256Cbc
          (ByteData *__return_storage_ptr__,ByteData *key,ByteData *iv,ByteData *data)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  uchar *key_00;
  size_type key_len;
  uchar *iv_00;
  size_type iv_len;
  uchar *bytes;
  uchar *bytes_out;
  size_type len;
  CfdException *this;
  string *in_stack_fffffffffffffe20;
  string *message;
  undefined4 in_stack_fffffffffffffe28;
  CfdError in_stack_fffffffffffffe2c;
  CfdException *in_stack_fffffffffffffe30;
  allocator local_131;
  string local_130 [32];
  CfdSourceLocation local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  int local_dc;
  undefined1 auStack_d8 [4];
  int ret;
  size_t written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  ByteData *local_30;
  ByteData *data_local;
  ByteData *iv_local;
  ByteData *key_local;
  
  local_30 = data;
  data_local = iv;
  iv_local = key;
  key_local = __return_storage_ptr__;
  sVar2 = ByteData::GetDataSize(key);
  if (sVar2 != 0x20) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x2cc;
    local_48.funcname = "DecryptAes256Cbc";
    logger::warn<>(&local_48,"wally_aes key size NG.");
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_68,"DecryptAes256Cbc key size error.",&local_69);
    CfdException::CfdException
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetDataSize(local_30);
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3ef71a);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30,
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (allocator_type *)in_stack_fffffffffffffe20);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x3ef742);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,iv_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written,data_local);
  auStack_d8[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffff29 = 0;
  key_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef784);
  key_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  iv_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef7b1);
  iv_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&written);
  ByteData::GetBytes(&local_f8,local_30);
  bytes = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef7e9);
  sVar2 = ByteData::GetDataSize(local_30);
  bytes_out = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3ef815);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  message = (string *)auStack_d8;
  iVar1 = wally_aes_cbc(key_00,key_len,iv_00,iv_len,bytes,sVar2,2,bytes_out,len,(size_t *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  local_dc = iVar1;
  if (iVar1 != 0) {
    local_110.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_util.cpp"
                 ,0x2f);
    local_110.filename = local_110.filename + 1;
    local_110.line = 0x2dc;
    local_110.funcname = "DecryptAes256Cbc";
    logger::warn<int&>(&local_110,"wally_aes_cbc NG[{}].",&local_dc);
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_130,"DecryptAes256Cbc error.",&local_131);
    CfdException::CfdException(this,in_stack_fffffffffffffe2c,message);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30,
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecryptAes256Cbc(
    const ByteData &key, const ByteData &iv, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "DecryptAes256Cbc key size error.");
  }

  std::vector<uint8_t> output(data.GetDataSize());
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> iv_data = iv.GetBytes();
  size_t written = 0;

  // Decrypt data using AES(CBC mode, PKCS#7 padding).
  int ret = wally_aes_cbc(
      key_data.data(), key_data.size(), iv_data.data(), iv_data.size(),
      data.GetBytes().data(), data.GetDataSize(), AES_FLAG_DECRYPT,
      output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes_cbc NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "DecryptAes256Cbc error.");
  }

  output.resize(written);
  return ByteData(output);
}